

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall llvm::cl::Option::addArgument(Option *this)

{
  uint uVar1;
  void **ppvVar2;
  atomic<void_*> this_00;
  void **ppvVar3;
  uint *puVar4;
  SmallPtrSetIteratorImpl local_48;
  SmallPtrSetIteratorImpl local_38;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  this_00._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  uVar1 = (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
          NumNonEmpty;
  if (uVar1 == (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
               NumTombstones) {
    if (TopLevelSubCommand == (SubCommand *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&TopLevelSubCommand,object_creator<llvm::cl::SubCommand>::call
                 ,object_deleter<llvm::cl::SubCommand>::call);
    }
    anon_unknown.dwarf_29469b::CommandLineParser::addOption
              ((CommandLineParser *)this_00._M_b._M_p,this,TopLevelSubCommand);
  }
  else {
    local_38.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    if (local_38.Bucket !=
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      uVar1 = (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              CurArraySize;
    }
    local_38.End = local_38.Bucket + uVar1;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    ppvVar2 = local_38.Bucket;
    local_48.Bucket = local_38.Bucket;
    local_48.End = local_38.End;
    local_38.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    puVar4 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              NumNonEmpty;
    if (local_38.Bucket !=
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar4 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase
                .CurArraySize;
    }
    local_38.Bucket = local_38.Bucket + *puVar4;
    local_38.End = local_38.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    ppvVar3 = local_38.Bucket;
    while (ppvVar2 != ppvVar3) {
      if (local_48.End <= ppvVar2) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      anon_unknown.dwarf_29469b::CommandLineParser::addOption
                ((CommandLineParser *)this_00._M_b._M_p,this,(SubCommand *)*ppvVar2);
      local_48.Bucket = local_48.Bucket + 1;
      SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
      ppvVar2 = local_48.Bucket;
    }
  }
  this->FullyInitialized = true;
  return;
}

Assistant:

void Option::addArgument() {
  GlobalParser->addOption(this);
  FullyInitialized = true;
}